

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Option<Catch::TestRunInfo>::reset(Option<Catch::TestRunInfo> *this)

{
  Option<Catch::TestRunInfo> *this_local;
  
  if (this->nullableValue != (TestRunInfo *)0x0) {
    TestRunInfo::~TestRunInfo(this->nullableValue);
  }
  this->nullableValue = (TestRunInfo *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = CATCH_NULL;
        }